

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::
     MatchPrintAndExplain<std::array<unsigned_long,4ul>const,std::array<unsigned_long,4ul>const&>
               (array<unsigned_long,_4UL> *value,
               Matcher<const_std::array<unsigned_long,_4UL>_&> *matcher,
               MatchResultListener *listener)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 local_200 [8];
  StringMatchResultListener inner_listener;
  string local_48;
  
  if (listener->stream_ != (ostream *)0x0) {
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_200);
    bVar1 = MatcherBase<const_std::array<unsigned_long,_4UL>_&>::MatchAndExplain
                      (&matcher->super_MatcherBase<const_std::array<unsigned_long,_4UL>_&>,value,
                       (MatchResultListener *)local_200);
    ContainerPrinter::PrintValue<std::array<unsigned_long,4ul>,void>(value,listener->stream_);
    GetTypeName<std::array<unsigned_long,4ul>const>();
    bVar2 = IsReadableTypeName(&local_48);
    if (bVar2) {
      poVar3 = std::operator<<(listener->stream_," (of type ");
      poVar3 = std::operator<<(poVar3,(string *)&local_48);
      std::operator<<(poVar3,")");
    }
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty((string *)&inner_listener.field_0x190,listener->stream_);
    std::__cxx11::string::~string((string *)&inner_listener.field_0x190);
    std::__cxx11::string::~string((string *)&local_48);
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_200);
    return bVar1;
  }
  bVar1 = MatcherBase<const_std::array<unsigned_long,_4UL>_&>::Matches
                    (&matcher->super_MatcherBase<const_std::array<unsigned_long,_4UL>_&>,value);
  return bVar1;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}